

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilbc_specific_functions.c
# Opt level: O0

void WebRtcSpl_ReverseOrderMultArrayElements
               (int16_t *out,int16_t *in,int16_t *win,size_t vector_length,int16_t right_shifts)

{
  short *local_50;
  int16_t *winptr;
  int16_t *inptr;
  int16_t *outptr;
  size_t i;
  int16_t right_shifts_local;
  size_t vector_length_local;
  int16_t *win_local;
  int16_t *in_local;
  int16_t *out_local;
  
  local_50 = win;
  winptr = in;
  inptr = out;
  for (outptr = (int16_t *)0x0; outptr < vector_length; outptr = (int16_t *)((long)outptr + 1)) {
    *inptr = (int16_t)((int)*winptr * (int)*local_50 >> ((byte)right_shifts & 0x1f));
    local_50 = local_50 + -1;
    winptr = winptr + 1;
    inptr = inptr + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_ReverseOrderMultArrayElements(int16_t *out, const int16_t *in,
                                             const int16_t *win,
                                             size_t vector_length,
                                             int16_t right_shifts)
{
    size_t i;
    int16_t *outptr = out;
    const int16_t *inptr = in;
    const int16_t *winptr = win;
    for (i = 0; i < vector_length; i++)
    {
      *outptr++ = (int16_t)((*inptr++ * *winptr--) >> right_shifts);
    }
}